

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int dwarf_lookup_pc(backtrace_state *state,dwarf_data *ddata,uintptr_t pc,
                   backtrace_full_callback callback,backtrace_error_callback error_callback,
                   void *data,int *found)

{
  char *__s;
  char *__s_00;
  int iVar1;
  size_t sVar2;
  size_t __n;
  bool bVar3;
  ulong *local_130;
  char *s;
  size_t dir_len;
  char *dir;
  size_t filename_len;
  char *filename_1;
  function_vector *pfvec;
  size_t count;
  line_header lhdr;
  size_t function_addrs_count;
  function_addrs *function_addrs;
  int ret;
  int lineno;
  char *filename;
  function *function;
  function_addrs *fmatch;
  function_addrs *p;
  line *ln;
  line *lines;
  ulong uStack_58;
  int new_data;
  unit *u;
  ulong *puStack_48;
  int found_entry;
  unit_addrs *entry;
  void *data_local;
  backtrace_error_callback error_callback_local;
  backtrace_full_callback callback_local;
  uintptr_t pc_local;
  dwarf_data *ddata_local;
  backtrace_state *state_local;
  
  *found = 1;
  entry = (unit_addrs *)data;
  data_local = error_callback;
  error_callback_local = (backtrace_error_callback)callback;
  callback_local = (backtrace_full_callback)pc;
  pc_local = (uintptr_t)ddata;
  ddata_local = (dwarf_data *)state;
  if ((ddata->addrs_count == 0) || (pc == 0xffffffffffffffff)) {
    local_130 = (ulong *)0x0;
  }
  else {
    local_130 = (ulong *)bsearch(&callback_local,ddata->addrs,ddata->addrs_count,0x18,
                                 unit_addrs_search);
  }
  puStack_48 = local_130;
  if (local_130 == (ulong *)0x0) {
    *found = 0;
    state_local._4_4_ = 0;
  }
  else {
    for (; callback_local == (backtrace_full_callback)puStack_48[3]; puStack_48 = puStack_48 + 3) {
    }
    u._4_4_ = 0;
    for (; (backtrace_full_callback)puStack_48[1] <= callback_local; puStack_48 = puStack_48 + -3) {
      if ((puStack_48 == *(ulong **)(pc_local + 0x18)) || (puStack_48[-3] < *puStack_48))
      goto LAB_0015e676;
    }
    u._4_4_ = 1;
LAB_0015e676:
    if (u._4_4_ == 0) {
      *found = 0;
      state_local._4_4_ = 0;
    }
    else {
      uStack_58 = puStack_48[2];
      ln = *(line **)(uStack_58 + 0x80);
      while( true ) {
        bVar3 = false;
        if ((*(ulong **)(pc_local + 0x18) < puStack_48) &&
           (bVar3 = false, (backtrace_full_callback)puStack_48[-3] <= callback_local)) {
          bVar3 = callback_local < (backtrace_full_callback)puStack_48[-2];
        }
        if (!bVar3) break;
        if (*(int *)&ddata_local->altlink != 0) {
          abort();
        }
        if (ln != (line *)0xffffffffffffffff) break;
        uStack_58 = puStack_48[-1];
        ln = *(line **)(uStack_58 + 0x80);
        puStack_48 = puStack_48 + -3;
      }
      if (*(int *)&ddata_local->altlink != 0) {
        abort();
      }
      lines._4_4_ = 0;
      if (ln == (line *)0x0) {
        function_addrs_count = 0;
        lhdr.filenames = (char **)0x0;
        iVar1 = read_line_info((backtrace_state *)ddata_local,(dwarf_data *)pc_local,
                               (backtrace_error_callback)data_local,entry,(unit *)puStack_48[2],
                               (line_header *)&count,&ln,(size_t *)&pfvec);
        if (iVar1 != 0) {
          if (*(int *)&ddata_local->altlink == 0) {
            filename_1 = (char *)(pc_local + 0xd0);
          }
          else {
            filename_1 = (char *)0x0;
          }
          read_function_info((backtrace_state *)ddata_local,(dwarf_data *)pc_local,
                             (line_header *)&count,(backtrace_error_callback)data_local,entry,
                             (unit *)puStack_48[2],(function_vector *)filename_1,
                             (function_addrs **)&function_addrs_count,(size_t *)&lhdr.filenames);
          free_line_header((backtrace_state *)ddata_local,(line_header *)&count,
                           (backtrace_error_callback)data_local,entry);
          lines._4_4_ = 1;
        }
        if (*(int *)&ddata_local->altlink != 0) {
          abort();
        }
        *(function_vector **)(uStack_58 + 0x88) = pfvec;
        *(size_t *)(uStack_58 + 0x90) = function_addrs_count;
        *(char ***)(uStack_58 + 0x98) = lhdr.filenames;
        *(line **)(uStack_58 + 0x80) = ln;
      }
      if (ln == (line *)0xffffffffffffffff) {
        if (lines._4_4_ == 0) {
          state_local._4_4_ = (*error_callback_local)(entry,(char *)callback_local,0);
        }
        else {
          state_local._4_4_ =
               dwarf_lookup_pc((backtrace_state *)ddata_local,(dwarf_data *)pc_local,
                               (uintptr_t)callback_local,
                               (backtrace_full_callback)error_callback_local,
                               (backtrace_error_callback)data_local,entry,found);
        }
      }
      else {
        p = (function_addrs *)
            bsearch(&callback_local,ln,*(size_t *)(puStack_48[2] + 0x88),0x18,line_search);
        if (p == (function_addrs *)0x0) {
          if (*(long *)(puStack_48[2] + 0x68) == 0) {
            __s = *(char **)(puStack_48[2] + 0x58);
            filename_len = (size_t)__s;
            if (((__s != (char *)0x0) && (*__s != '/')) && (*(long *)(puStack_48[2] + 0x60) != 0)) {
              sVar2 = strlen(__s);
              __s_00 = *(char **)(puStack_48[2] + 0x60);
              __n = strlen(__s_00);
              filename_len = (size_t)tcmalloc_backtrace_alloc
                                               ((backtrace_state *)ddata_local,__n + sVar2 + 2,
                                                (backtrace_error_callback)data_local,entry);
              if ((void *)filename_len == (void *)0x0) {
                *found = 0;
                return 0;
              }
              memcpy((void *)filename_len,__s_00,__n);
              *(undefined1 *)(filename_len + __n) = 0x2f;
              memcpy((void *)(filename_len + __n + 1),__s,sVar2 + 1);
            }
            *(size_t *)(puStack_48[2] + 0x68) = filename_len;
          }
          state_local._4_4_ =
               (*error_callback_local)
                         (entry,(char *)callback_local,(int)*(undefined8 *)(puStack_48[2] + 0x68));
        }
        else if (*(long *)(puStack_48[2] + 0x98) == 0) {
          state_local._4_4_ = (*error_callback_local)(entry,(char *)callback_local,(int)p->high);
        }
        else {
          fmatch = (function_addrs *)
                   bsearch(&callback_local,*(void **)(puStack_48[2] + 0x90),
                           *(size_t *)(puStack_48[2] + 0x98),0x18,function_addrs_search);
          if (fmatch == (function_addrs *)0x0) {
            state_local._4_4_ = (*error_callback_local)(entry,(char *)callback_local,(int)p->high);
          }
          else {
            for (; callback_local == (backtrace_full_callback)fmatch[1].low; fmatch = fmatch + 1) {
            }
            function = (function *)0x0;
            for (; (backtrace_full_callback)fmatch->high <= callback_local; fmatch = fmatch + -1) {
              if ((fmatch == *(function_addrs **)(puStack_48[2] + 0x90)) ||
                 (fmatch[-1].low < fmatch->low)) goto LAB_0015ebc9;
            }
            function = (function *)fmatch;
LAB_0015ebc9:
            if (function == (function *)0x0) {
              state_local._4_4_ = (*error_callback_local)(entry,(char *)callback_local,(int)p->high)
              ;
            }
            else {
              filename = *(char **)&function->caller_lineno;
              _ret = (char *)p->high;
              function_addrs._4_4_ = *(undefined4 *)&p->function;
              function_addrs._0_4_ =
                   report_inlined_functions
                             ((uintptr_t)callback_local,(function *)filename,
                              (backtrace_full_callback)error_callback_local,entry,(char **)&ret,
                              (int *)((long)&function_addrs + 4));
              state_local._4_4_ = (int)function_addrs;
              if ((int)function_addrs == 0) {
                state_local._4_4_ = (*error_callback_local)(entry,(char *)callback_local,(int)_ret);
              }
            }
          }
        }
      }
    }
  }
  return state_local._4_4_;
}

Assistant:

static int
dwarf_lookup_pc (struct backtrace_state *state, struct dwarf_data *ddata,
		 uintptr_t pc, backtrace_full_callback callback,
		 backtrace_error_callback error_callback, void *data,
		 int *found)
{
  struct unit_addrs *entry;
  int found_entry;
  struct unit *u;
  int new_data;
  struct line *lines;
  struct line *ln;
  struct function_addrs *p;
  struct function_addrs *fmatch;
  struct function *function;
  const char *filename;
  int lineno;
  int ret;

  *found = 1;

  /* Find an address range that includes PC.  Our search isn't safe if
     PC == -1, as we use that as a sentinel value, so skip the search
     in that case.  */
  entry = (ddata->addrs_count == 0 || pc + 1 == 0
	   ? NULL
	   : bsearch (&pc, ddata->addrs, ddata->addrs_count,
		      sizeof (struct unit_addrs), unit_addrs_search));

  if (entry == NULL)
    {
      *found = 0;
      return 0;
    }

  /* Here pc >= entry->low && pc < (entry + 1)->low.  The unit_addrs
     are sorted by low, so if pc > p->low we are at the end of a range
     of unit_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (entry + 1)->low)
    ++entry;
  found_entry = 0;
  while (1)
    {
      if (pc < entry->high)
	{
	  found_entry = 1;
	  break;
	}
      if (entry == ddata->addrs)
	break;
      if ((entry - 1)->low < entry->low)
	break;
      --entry;
    }
  if (!found_entry)
    {
      *found = 0;
      return 0;
    }

  /* We need the lines, lines_count, function_addrs,
     function_addrs_count fields of u.  If they are not set, we need
     to set them.  When running in threaded mode, we need to allow for
     the possibility that some other thread is setting them
     simultaneously.  */

  u = entry->u;
  lines = u->lines;

  /* Skip units with no useful line number information by walking
     backward.  Useless line number information is marked by setting
     lines == -1.  */
  while (entry > ddata->addrs
	 && pc >= (entry - 1)->low
	 && pc < (entry - 1)->high)
    {
      if (state->threaded)
	lines = (struct line *) backtrace_atomic_load_pointer (&u->lines);

      if (lines != (struct line *) (uintptr_t) -1)
	break;

      --entry;

      u = entry->u;
      lines = u->lines;
    }

  if (state->threaded)
    lines = backtrace_atomic_load_pointer (&u->lines);

  new_data = 0;
  if (lines == NULL)
    {
      struct function_addrs *function_addrs;
      size_t function_addrs_count;
      struct line_header lhdr;
      size_t count;

      /* We have never read the line information for this unit.  Read
	 it now.  */

      function_addrs = NULL;
      function_addrs_count = 0;
      if (read_line_info (state, ddata, error_callback, data, entry->u, &lhdr,
			  &lines, &count))
	{
	  struct function_vector *pfvec;

	  /* If not threaded, reuse DDATA->FVEC for better memory
	     consumption.  */
	  if (state->threaded)
	    pfvec = NULL;
	  else
	    pfvec = &ddata->fvec;
	  read_function_info (state, ddata, &lhdr, error_callback, data,
			      entry->u, pfvec, &function_addrs,
			      &function_addrs_count);
	  free_line_header (state, &lhdr, error_callback, data);
	  new_data = 1;
	}

      /* Atomically store the information we just read into the unit.
	 If another thread is simultaneously writing, it presumably
	 read the same information, and we don't care which one we
	 wind up with; we just leak the other one.  We do have to
	 write the lines field last, so that the acquire-loads above
	 ensure that the other fields are set.  */

      if (!state->threaded)
	{
	  u->lines_count = count;
	  u->function_addrs = function_addrs;
	  u->function_addrs_count = function_addrs_count;
	  u->lines = lines;
	}
      else
	{
	  backtrace_atomic_store_size_t (&u->lines_count, count);
	  backtrace_atomic_store_pointer (&u->function_addrs, function_addrs);
	  backtrace_atomic_store_size_t (&u->function_addrs_count,
					 function_addrs_count);
	  backtrace_atomic_store_pointer (&u->lines, lines);
	}
    }

  /* Now all fields of U have been initialized.  */

  if (lines == (struct line *) (uintptr_t) -1)
    {
      /* If reading the line number information failed in some way,
	 try again to see if there is a better compilation unit for
	 this PC.  */
      if (new_data)
	return dwarf_lookup_pc (state, ddata, pc, callback, error_callback,
				data, found);
      return callback (data, pc, NULL, 0, NULL);
    }

  /* Search for PC within this unit.  */

  ln = (struct line *) bsearch (&pc, lines, entry->u->lines_count,
				sizeof (struct line), line_search);
  if (ln == NULL)
    {
      /* The PC is between the low_pc and high_pc attributes of the
	 compilation unit, but no entry in the line table covers it.
	 This implies that the start of the compilation unit has no
	 line number information.  */

      if (entry->u->abs_filename == NULL)
	{
	  const char *filename;

	  filename = entry->u->filename;
	  if (filename != NULL
	      && !IS_ABSOLUTE_PATH (filename)
	      && entry->u->comp_dir != NULL)
	    {
	      size_t filename_len;
	      const char *dir;
	      size_t dir_len;
	      char *s;

	      filename_len = strlen (filename);
	      dir = entry->u->comp_dir;
	      dir_len = strlen (dir);
	      s = (char *) backtrace_alloc (state, dir_len + filename_len + 2,
					    error_callback, data);
	      if (s == NULL)
		{
		  *found = 0;
		  return 0;
		}
	      memcpy (s, dir, dir_len);
	      /* FIXME: Should use backslash if DOS file system.  */
	      s[dir_len] = '/';
	      memcpy (s + dir_len + 1, filename, filename_len + 1);
	      filename = s;
	    }
	  entry->u->abs_filename = filename;
	}

      return callback (data, pc, entry->u->abs_filename, 0, NULL);
    }

  /* Search for function name within this unit.  */

  if (entry->u->function_addrs_count == 0)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  p = ((struct function_addrs *)
       bsearch (&pc, entry->u->function_addrs,
		entry->u->function_addrs_count,
		sizeof (struct function_addrs),
		function_addrs_search));
  if (p == NULL)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  /* Here pc >= p->low && pc < (p + 1)->low.  The function_addrs are
     sorted by low, so if pc > p->low we are at the end of a range of
     function_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (p + 1)->low)
    ++p;
  fmatch = NULL;
  while (1)
    {
      if (pc < p->high)
	{
	  fmatch = p;
	  break;
	}
      if (p == entry->u->function_addrs)
	break;
      if ((p - 1)->low < p->low)
	break;
      --p;
    }
  if (fmatch == NULL)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  function = fmatch->function;

  filename = ln->filename;
  lineno = ln->lineno;

  ret = report_inlined_functions (pc, function, callback, data,
				  &filename, &lineno);
  if (ret != 0)
    return ret;

  return callback (data, pc, filename, lineno, function->name);
}